

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cc
# Opt level: O2

string * __thiscall ConfigFile::trim(string *__return_storage_ptr__,ConfigFile *this,string *str)

{
  _Iter_pred<ConfigFile::trim(std::__cxx11::string_const&)::__0> *p_Var1;
  pointer pcVar2;
  pointer pcVar3;
  bool bVar4;
  long lVar5;
  _Iter_pred<ConfigFile::trim(std::__cxx11::string_const&)::__0> *__it;
  _Iter_pred<ConfigFile::trim(std::__cxx11::string_const&)::__0> *p_Var6;
  size_type sVar7;
  pointer pcVar8;
  pointer pcVar9;
  _Iter_pred<ConfigFile::trim(std::__cxx11::string_const&)::__0> *this_00;
  pointer local_68;
  pointer local_60;
  pointer local_58;
  pointer local_50;
  pointer local_48;
  pointer local_40;
  pointer local_38;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  __it = (_Iter_pred<ConfigFile::trim(std::__cxx11::string_const&)::__0> *)
         (__return_storage_ptr__->_M_dataplus)._M_p;
  sVar7 = __return_storage_ptr__->_M_string_length;
  p_Var1 = __it + sVar7;
  this_00 = __it;
  for (lVar5 = (long)sVar7 >> 2; p_Var6 = this_00, 0 < lVar5; lVar5 = lVar5 + -1) {
    bVar4 = __gnu_cxx::__ops::_Iter_pred<ConfigFile::trim(std::__cxx11::string_const&)::$_0>::
            operator()(this_00,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )str);
    if (bVar4) goto LAB_001353f9;
    bVar4 = __gnu_cxx::__ops::_Iter_pred<ConfigFile::trim(std::__cxx11::string_const&)::$_0>::
            operator()(this_00 + 1,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )str);
    p_Var6 = this_00 + 1;
    if (bVar4) goto LAB_001353f9;
    bVar4 = __gnu_cxx::__ops::_Iter_pred<ConfigFile::trim(std::__cxx11::string_const&)::$_0>::
            operator()(this_00 + 2,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )str);
    p_Var6 = this_00 + 2;
    if (bVar4) goto LAB_001353f9;
    bVar4 = __gnu_cxx::__ops::_Iter_pred<ConfigFile::trim(std::__cxx11::string_const&)::$_0>::
            operator()(this_00 + 3,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )str);
    p_Var6 = this_00 + 3;
    if (bVar4) goto LAB_001353f9;
    this_00 = this_00 + 4;
    sVar7 = sVar7 - 4;
  }
  if (sVar7 == 1) {
LAB_0013552c:
    bVar4 = __gnu_cxx::__ops::_Iter_pred<ConfigFile::trim(std::__cxx11::string_const&)::$_0>::
            operator()(this_00,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )str);
    p_Var6 = p_Var1;
    if (bVar4) {
      p_Var6 = this_00;
    }
  }
  else if (sVar7 == 2) {
LAB_001353d4:
    bVar4 = __gnu_cxx::__ops::_Iter_pred<ConfigFile::trim(std::__cxx11::string_const&)::$_0>::
            operator()(p_Var6,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               )str);
    if (!bVar4) {
      this_00 = p_Var6 + 1;
      goto LAB_0013552c;
    }
  }
  else {
    p_Var6 = p_Var1;
    if ((sVar7 == 3) &&
       (bVar4 = __gnu_cxx::__ops::_Iter_pred<ConfigFile::trim(std::__cxx11::string_const&)::$_0>::
                operator()(this_00,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )str), p_Var6 = this_00, !bVar4)) {
      p_Var6 = this_00 + 1;
      goto LAB_001353d4;
    }
  }
LAB_001353f9:
  std::__cxx11::string::erase(__return_storage_ptr__,__it,p_Var6);
  pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
  sVar7 = __return_storage_ptr__->_M_string_length;
  pcVar2 = pcVar3 + sVar7;
  for (lVar5 = (long)sVar7 >> 2; pcVar8 = pcVar3 + sVar7, pcVar9 = pcVar8, 0 < lVar5;
      lVar5 = lVar5 + -1) {
    local_50 = pcVar8;
    bVar4 = __gnu_cxx::__ops::_Iter_pred<ConfigFile::trim(std::__cxx11::string_const&)::$_1>::
            operator()((_Iter_pred<ConfigFile::trim(std::__cxx11::string_const&)::__1> *)&local_50,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__it);
    if (bVar4) goto LAB_001354bb;
    local_58 = pcVar3 + (sVar7 - 1);
    bVar4 = __gnu_cxx::__ops::_Iter_pred<ConfigFile::trim(std::__cxx11::string_const&)::$_1>::
            operator()((_Iter_pred<ConfigFile::trim(std::__cxx11::string_const&)::__1> *)&local_58,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__it);
    pcVar9 = pcVar3 + (sVar7 - 1);
    if (bVar4) goto LAB_001354bb;
    local_60 = pcVar3 + (sVar7 - 2);
    bVar4 = __gnu_cxx::__ops::_Iter_pred<ConfigFile::trim(std::__cxx11::string_const&)::$_1>::
            operator()((_Iter_pred<ConfigFile::trim(std::__cxx11::string_const&)::__1> *)&local_60,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__it);
    pcVar9 = pcVar3 + (sVar7 - 2);
    if (bVar4) goto LAB_001354bb;
    local_68 = pcVar3 + (sVar7 - 3);
    bVar4 = __gnu_cxx::__ops::_Iter_pred<ConfigFile::trim(std::__cxx11::string_const&)::$_1>::
            operator()((_Iter_pred<ConfigFile::trim(std::__cxx11::string_const&)::__1> *)&local_68,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__it);
    pcVar9 = pcVar3 + (sVar7 - 3);
    if (bVar4) goto LAB_001354bb;
    sVar7 = sVar7 - 4;
  }
  if (sVar7 == 3) {
    local_38 = pcVar8;
    bVar4 = __gnu_cxx::__ops::_Iter_pred<ConfigFile::trim(std::__cxx11::string_const&)::$_1>::
            operator()((_Iter_pred<ConfigFile::trim(std::__cxx11::string_const&)::__1> *)&local_38,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__it);
    if (bVar4) goto LAB_001354bb;
    pcVar8 = pcVar3 + 2;
LAB_001354fa:
    local_40 = pcVar8;
    bVar4 = __gnu_cxx::__ops::_Iter_pred<ConfigFile::trim(std::__cxx11::string_const&)::$_1>::
            operator()((_Iter_pred<ConfigFile::trim(std::__cxx11::string_const&)::__1> *)&local_40,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__it);
    pcVar9 = pcVar8;
    if (bVar4) goto LAB_001354bb;
    pcVar8 = pcVar8 + -1;
  }
  else {
    if (sVar7 == 2) goto LAB_001354fa;
    pcVar9 = pcVar3;
    if (sVar7 != 1) goto LAB_001354bb;
  }
  local_48 = pcVar8;
  bVar4 = __gnu_cxx::__ops::_Iter_pred<ConfigFile::trim(std::__cxx11::string_const&)::$_1>::
          operator()((_Iter_pred<ConfigFile::trim(std::__cxx11::string_const&)::__1> *)&local_48,
                     (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)__it);
  pcVar9 = pcVar3;
  if (bVar4) {
    pcVar9 = pcVar8;
  }
LAB_001354bb:
  std::__cxx11::string::erase(__return_storage_ptr__,pcVar9,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string
ConfigFile::trim(const std::string &str) {
  std::string tmp = str;
  tmp.erase(tmp.begin(),
            std::find_if(tmp.begin(), tmp.end(),
                         [](int c) {return !std::isspace(c);}));
  tmp.erase(std::find_if(tmp.rbegin(), tmp.rend(),
                         [](int c) {return !std::isspace(c);})
                .base(),
            tmp.end());

  return tmp;
}